

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit-array.hpp
# Opt level: O0

void __thiscall baryonyx::bit_array_impl::invert(bit_array_impl *this,int index)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  type puVar4;
  int index_local;
  bit_array_impl *this_local;
  
  bVar1 = false;
  if (-1 < index) {
    bVar1 = index < this->m_size;
  }
  if (!bVar1) {
    details::fail_fast("Assertion","index >= 0 && index < m_size",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/bit-array.hpp"
                       ,"164");
  }
  iVar2 = b_offset(index);
  iVar3 = b_index(index);
  puVar4 = std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::operator[]
                     (&this->m_data,(long)iVar3);
  *puVar4 = 1L << ((ulong)(byte)iVar2 & 0x3f) ^ *puVar4;
  return;
}

Assistant:

void invert(int index) noexcept
    {
        bx_assert(index >= 0 && index < m_size);

        m_data[b_index(index)] ^= k_one << b_offset(index);
    }